

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_tri(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell_00;
  REF_STATUS RVar2;
  FILE *__stream;
  void *__ptr;
  void *__ptr_00;
  int local_d4;
  int local_d0;
  int local_cc;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT nodes [27];
  int local_54;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT nnode;
  REF_INT node;
  REF_NODE ref_node;
  FILE *f;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa11,
           "ref_export_tri","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa13,
           "ref_export_tri","malloc o2n of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)pRVar1->max << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0xa13,"ref_export_tri","malloc o2n of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (local_cc = 0; local_cc < pRVar1->max; local_cc = local_cc + 1) {
        *(undefined4 *)((long)__ptr + (long)local_cc * 4) = 0xffffffff;
      }
      if (pRVar1->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xa14,"ref_export_tri","malloc n2o of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        __ptr_00 = malloc((long)pRVar1->max << 2);
        if (__ptr_00 == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0xa14,"ref_export_tri","malloc n2o of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (local_d0 = 0; local_d0 < pRVar1->max; local_d0 = local_d0 + 1) {
            *(undefined4 *)((long)__ptr_00 + (long)local_d0 * 4) = 0xffffffff;
          }
          o2n._0_4_ = 0;
          for (o2n._4_4_ = 0; o2n._4_4_ < pRVar1->max; o2n._4_4_ = o2n._4_4_ + 1) {
            if (((-1 < o2n._4_4_) && (o2n._4_4_ < pRVar1->max)) && (-1 < pRVar1->global[o2n._4_4_]))
            {
              if ((o2n._4_4_ < 0) || (ref_cell_00->ref_adj->nnode <= o2n._4_4_)) {
                local_d4 = -1;
              }
              else {
                local_d4 = ref_cell_00->ref_adj->first[o2n._4_4_];
              }
              if (local_d4 != -1) {
                *(uint *)((long)__ptr + (long)o2n._4_4_ * 4) = (uint)o2n;
                *(int *)((long)__ptr_00 + (long)(int)(uint)o2n * 4) = o2n._4_4_;
                o2n._0_4_ = (uint)o2n + 1;
              }
            }
          }
          fprintf(__stream,"%d %d\n",(ulong)(uint)o2n,(ulong)(uint)ref_cell_00->n);
          for (o2n._4_4_ = 0; o2n._4_4_ < (int)(uint)o2n; o2n._4_4_ = o2n._4_4_ + 1) {
            fprintf(__stream,"%.16E %.16E %.16E\n",
                    pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf],
                    pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf + 1],
                    pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf + 2]);
          }
          for (local_54 = 0; local_54 < ref_cell_00->max; local_54 = local_54 + 1) {
            RVar2 = ref_cell_nodes(ref_cell_00,local_54,&ref_malloc_init_i_1);
            if (RVar2 == 0) {
              fprintf(__stream,"%d %d %d\n",
                      (ulong)(*(int *)((long)__ptr + (long)ref_malloc_init_i_1 * 4) + 1),
                      (ulong)(*(int *)((long)__ptr + (long)ref_malloc_init_i * 4) + 1),
                      (ulong)(*(int *)((long)__ptr + (long)nodes[0] * 4) + 1));
            }
          }
          for (local_54 = 0; local_54 < ref_cell_00->max; local_54 = local_54 + 1) {
            RVar2 = ref_cell_nodes(ref_cell_00,local_54,&ref_malloc_init_i_1);
            if (RVar2 == 0) {
              fprintf(__stream,"%d\n",(ulong)(uint)nodes[1]);
            }
          }
          if (__ptr_00 != (void *)0x0) {
            free(__ptr_00);
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          fclose(__stream);
          ref_grid_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tri(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, nnode;
  REF_INT *o2n, *n2o;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (!ref_cell_node_empty(ref_cell, node)) {
      o2n[node] = nnode;
      n2o[nnode] = node;
      nnode++;
    }
  }

  fprintf(f, "%d %d\n", nnode, ref_cell_n(ref_cell));
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E %.16E\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1);
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(f, "%d\n", nodes[3]);
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}